

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref.hpp
# Opt level: O1

void __thiscall ftxui::Ref<ftxui::RadioboxOption>::~Ref(Ref<ftxui::RadioboxOption> *this)

{
  Decorator *pDVar1;
  function<void_()> *pfVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  p_Var3 = (this->owned_).on_change.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar2 = &(this->owned_).on_change;
    (*p_Var3)((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  p_Var3 = (this->owned_).style_unfocused.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pDVar1 = &(this->owned_).style_unfocused;
    (*p_Var3)((_Any_data *)pDVar1,(_Any_data *)pDVar1,__destroy_functor);
  }
  p_Var3 = (this->owned_).style_focused.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pDVar1 = &(this->owned_).style_focused;
    (*p_Var3)((_Any_data *)pDVar1,(_Any_data *)pDVar1,__destroy_functor);
  }
  pcVar4 = (this->owned_).style_unchecked._M_dataplus._M_p;
  paVar5 = &(this->owned_).style_unchecked.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->owned_).style_checked._M_dataplus._M_p;
  paVar5 = &(this->owned_).style_checked.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Ref(T t) : owned_(t) {}